

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O1

void ExportSkin(Asset *mAsset,aiMesh *aimesh,Ref<glTF2::Mesh> *meshRef,Ref<glTF2::Buffer> *bufferRef
               ,Ref<glTF2::Skin> *skinRef,
               vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
               *inverseBindMatricesData)

{
  pointer *ppaVar1;
  pointer *ppRVar2;
  pointer *ppRVar3;
  aiMatrix4x4 *paVar4;
  float fVar5;
  aiBone *paVar6;
  iterator __position;
  pointer pPVar7;
  Accessor *pAVar8;
  size_t __n;
  long *plVar9;
  void *__src;
  iterator iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  int iVar21;
  void *__s;
  void *__s_00;
  void *pvVar22;
  void *__src_00;
  void *__dest;
  Ref<glTF2::Node> *pRVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  ulong uVar27;
  long lVar28;
  iterator __position_00;
  Skin *pSVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  Ref<glTF2::Node> RVar34;
  Ref<glTF2::Accessor> RVar35;
  Ref<glTF2::Accessor> local_b0;
  aiMatrix4x4 tmpMatrix4;
  
  if (aimesh->mNumBones != 0) {
    uVar24 = (ulong)aimesh->mNumVertices;
    uVar27 = uVar24 << 4;
    __s = operator_new__(uVar27);
    __s_00 = operator_new__(uVar27);
    pvVar22 = operator_new__(uVar24 * 4);
    if (uVar24 != 0) {
      uVar31 = 0;
      memset(__s,0,uVar27);
      memset(__s_00,0,uVar27);
      do {
        *(undefined4 *)((long)pvVar22 + uVar31 * 4) = 0;
        uVar31 = uVar31 + 1;
      } while (uVar24 != uVar31);
    }
    if (aimesh->mNumBones != 0) {
      uVar24 = 0;
      do {
        paVar6 = aimesh->mBones[uVar24];
        RVar34 = glTF2::LazyDict<glTF2::Node>::Get(&mAsset->nodes,(paVar6->mName).data);
        local_b0.vector =
             (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)RVar34.vector;
        local_b0.index = RVar34.index;
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(((_Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
                     &(local_b0.vector)->
                      super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)->
                    _M_impl).super__Vector_impl_data._M_start[local_b0.index]->jointName);
        pSVar29 = (skinRef->vector->
                  super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[skinRef->index];
        pRVar23 = *(Ref<glTF2::Node> **)
                   &(pSVar29->jointNames).
                    super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                    ._M_impl;
        __position_00._M_current =
             *(pointer *)
              ((long)&(pSVar29->jointNames).
                      super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
              + 8);
        if (__position_00._M_current == pRVar23) {
          bVar26 = true;
          uVar30 = 0;
        }
        else {
          bVar26 = true;
          uVar27 = 0;
          uVar32 = 1;
          uVar30 = 0;
          do {
            iVar21 = std::__cxx11::string::compare
                               ((string *)
                                &((pRVar23[uVar27].vector)->
                                 super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[pRVar23[uVar27].index]->
                                 jointName);
            if (iVar21 == 0) {
              bVar26 = false;
              uVar30 = uVar32 - 1;
            }
            uVar27 = (ulong)uVar32;
            pSVar29 = (skinRef->vector->
                      super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[skinRef->index];
            pRVar23 = *(Ref<glTF2::Node> **)
                       &(pSVar29->jointNames).
                        super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                        ._M_impl;
            __position_00._M_current =
                 *(pointer *)
                  ((long)&(pSVar29->jointNames).
                          super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                  + 8);
            uVar32 = uVar32 + 1;
          } while (uVar27 < (ulong)((long)__position_00._M_current - (long)pRVar23 >> 4));
        }
        if (bVar26) {
          if (__position_00._M_current ==
              *(pointer *)
               ((long)&(pSVar29->jointNames).
                       super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
               + 0x10)) {
            std::vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>>::
            _M_realloc_insert<glTF2::Ref<glTF2::Node>const&>
                      ((vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>> *)
                       &pSVar29->jointNames,__position_00,(Ref<glTF2::Node> *)&local_b0);
          }
          else {
            (__position_00._M_current)->vector =
                 (vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)local_b0.vector;
            *(ulong *)&(__position_00._M_current)->index = CONCAT44(local_b0._12_4_,local_b0.index);
            ppRVar3 = (pointer *)
                      ((long)&(pSVar29->jointNames).
                              super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                      + 8);
            *ppRVar3 = *ppRVar3 + 1;
          }
          paVar4 = &paVar6->mOffsetMatrix;
          tmpMatrix4.a1 = paVar4->a1;
          tmpMatrix4.a2 = (paVar6->mOffsetMatrix).a2;
          fVar17 = paVar4->a1;
          fVar18 = paVar4->a2;
          tmpMatrix4.a3 = (paVar6->mOffsetMatrix).a3;
          tmpMatrix4.a4 = (paVar6->mOffsetMatrix).a4;
          fVar19 = (paVar6->mOffsetMatrix).a3;
          fVar20 = (paVar6->mOffsetMatrix).a4;
          tmpMatrix4.b1 = (paVar6->mOffsetMatrix).b1;
          tmpMatrix4.b2 = (paVar6->mOffsetMatrix).b2;
          fVar15 = (paVar6->mOffsetMatrix).b1;
          fVar16 = (paVar6->mOffsetMatrix).b2;
          tmpMatrix4.b3 = (paVar6->mOffsetMatrix).b3;
          tmpMatrix4.b4 = (paVar6->mOffsetMatrix).b4;
          tmpMatrix4.c1 = (paVar6->mOffsetMatrix).c1;
          tmpMatrix4.c2 = (paVar6->mOffsetMatrix).c2;
          tmpMatrix4.c3 = (paVar6->mOffsetMatrix).c3;
          tmpMatrix4.c4 = (paVar6->mOffsetMatrix).c4;
          fVar13 = (paVar6->mOffsetMatrix).c3;
          fVar14 = (paVar6->mOffsetMatrix).c4;
          tmpMatrix4.d1 = (paVar6->mOffsetMatrix).d1;
          tmpMatrix4.d2 = (paVar6->mOffsetMatrix).d2;
          fVar5 = (paVar6->mOffsetMatrix).d2;
          tmpMatrix4.d3 = (paVar6->mOffsetMatrix).d3;
          tmpMatrix4.d4 = (paVar6->mOffsetMatrix).d4;
          fVar11 = (paVar6->mOffsetMatrix).d3;
          fVar12 = (paVar6->mOffsetMatrix).d4;
          __position._M_current =
               (inverseBindMatricesData->
               super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (inverseBindMatricesData->
              super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>>::
            _M_realloc_insert<aiMatrix4x4t<float>const&>
                      ((vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>> *)
                       inverseBindMatricesData,__position,&tmpMatrix4);
          }
          else {
            (__position._M_current)->d1 = (paVar6->mOffsetMatrix).d1;
            (__position._M_current)->d2 = fVar5;
            (__position._M_current)->d3 = fVar11;
            (__position._M_current)->d4 = fVar12;
            (__position._M_current)->c1 = tmpMatrix4.c1;
            (__position._M_current)->c2 = tmpMatrix4.c2;
            (__position._M_current)->c3 = fVar13;
            (__position._M_current)->c4 = fVar14;
            (__position._M_current)->b1 = fVar15;
            (__position._M_current)->b2 = fVar16;
            (__position._M_current)->b3 = tmpMatrix4.b3;
            (__position._M_current)->b4 = tmpMatrix4.b4;
            (__position._M_current)->a1 = fVar17;
            (__position._M_current)->a2 = fVar18;
            (__position._M_current)->a3 = fVar19;
            (__position._M_current)->a4 = fVar20;
            ppaVar1 = &(inverseBindMatricesData->
                       super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
          uVar30 = (int)((ulong)((long)(inverseBindMatricesData->
                                       super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(inverseBindMatricesData->
                                      super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 6) - 1;
        }
        if (paVar6->mNumWeights != 0) {
          uVar27 = 0;
          do {
            uVar31 = (ulong)paVar6->mWeights[uVar27].mVertexId;
            iVar21 = *(int *)((long)pvVar22 + uVar31 * 4);
            lVar25 = (long)iVar21;
            if (lVar25 < 4) {
              fVar5 = paVar6->mWeights[uVar27].mWeight;
              *(float *)((long)__s + lVar25 * 4 + uVar31 * 0x10) = (float)uVar30;
              *(float *)((long)__s_00 + lVar25 * 4 + uVar31 * 0x10) = fVar5;
              *(int *)((long)pvVar22 + uVar31 * 4) = iVar21 + 1;
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 < paVar6->mNumWeights);
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 < aimesh->mNumBones);
    }
    pPVar7 = *(pointer *)
              ((long)&((meshRef->vector->
                       super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[meshRef->index]->primitives).
                      super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
              + 8);
    RVar35 = ExportData(mAsset,&((skinRef->vector->
                                 super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[skinRef->index]->
                                super_Object).id,bufferRef,(ulong)aimesh->mNumVertices,__s,VEC4,VEC4
                        ,ComponentType_FLOAT,false);
    tmpMatrix4.a1 = RVar35.vector._0_4_;
    tmpMatrix4.a2 = RVar35.vector._4_4_;
    tmpMatrix4.a3 = (float)RVar35.index;
    if (RVar35.vector != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
      pAVar8 = ((RVar35.vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(uint)tmpMatrix4.a3];
      lVar25 = *(long *)(*(long *)&(((pAVar8->bufferView).vector)->
                                   super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                   )._M_impl + (ulong)(pAVar8->bufferView).index * 8);
      __n = *(size_t *)(lVar25 + 0x60);
      uVar24 = *(ulong *)(lVar25 + 0x68);
      uVar32 = glTF2::ComponentTypeSize(pAVar8->componentType);
      lVar25 = *(long *)(*(long *)CONCAT44(tmpMatrix4.a2,tmpMatrix4.a1) +
                        (ulong)(uint)tmpMatrix4.a3 * 8);
      lVar25 = *(long *)(**(long **)(lVar25 + 0x50) + (ulong)*(uint *)(lVar25 + 0x58) * 8);
      plVar9 = *(long **)(lVar25 + 0x50);
      uVar33 = (ulong)*(uint *)(lVar25 + 0x58);
      __src_00 = operator_new__(uVar24);
      uVar31 = 0;
      uVar27 = 0;
      uVar30 = uVar32;
      do {
        *(short *)((long)__src_00 + uVar31) =
             (short)(int)*(float *)(uVar27 + *(long *)(*(long *)(*plVar9 + uVar33 * 8) + 0x70) + __n
                                   );
        uVar27 = (ulong)uVar30;
        uVar30 = uVar30 + uVar32;
        uVar31 = (ulong)((int)uVar31 + 2);
      } while (uVar27 <= uVar24);
      if (uVar24 != 0) {
        lVar25 = *(long *)(*plVar9 + uVar33 * 8);
        uVar27 = *(ulong *)(lVar25 + 0x50);
        __dest = operator_new__(uVar27);
        __src = *(void **)(lVar25 + 0x70);
        memcpy(__dest,__src,__n);
        memcpy((void *)((long)__dest + __n),__src_00,uVar24);
        lVar28 = uVar24 + __n;
        memcpy((void *)((long)__dest + lVar28),(void *)((long)__src + lVar28),uVar27 - lVar28);
        std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
        reset<unsigned_char,std::default_delete<unsigned_char[]>>
                  ((__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)(lVar25 + 0x70),__dest)
        ;
        *(ulong *)(lVar25 + 0x50) = uVar27;
      }
      *(undefined4 *)
       (*(long *)(*(long *)CONCAT44(tmpMatrix4.a2,tmpMatrix4.a1) + (ulong)(uint)tmpMatrix4.a3 * 8) +
       0x68) = 0x1403;
      lVar25 = *(long *)(*(long *)CONCAT44(tmpMatrix4.a2,tmpMatrix4.a1) +
                        (ulong)(uint)tmpMatrix4.a3 * 8);
      *(ulong *)(*(long *)(**(long **)(lVar25 + 0x50) + (ulong)*(uint *)(lVar25 + 0x58) * 8) + 0x68)
           = (uVar24 * 2) / (ulong)uVar32;
      iVar10._M_current = *(pointer *)((long)&pPVar7[-1].attributes.joint + 8);
      if (iVar10._M_current == *(pointer *)((long)&pPVar7[-1].attributes.joint + 0x10)) {
        std::vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>::
        _M_realloc_insert<glTF2::Ref<glTF2::Accessor>const&>
                  ((vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>
                    *)&pPVar7[-1].attributes.joint,iVar10,(Ref<glTF2::Accessor> *)&tmpMatrix4);
      }
      else {
        (iVar10._M_current)->vector =
             (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
             CONCAT44(tmpMatrix4.a2,tmpMatrix4.a1);
        *(ulong *)&(iVar10._M_current)->index = CONCAT44(tmpMatrix4.a4,tmpMatrix4.a3);
        ppRVar2 = (pointer *)((long)&pPVar7[-1].attributes.joint + 8);
        *ppRVar2 = *ppRVar2 + 1;
      }
      operator_delete__(__src_00);
    }
    RVar35 = ExportData(mAsset,&((skinRef->vector->
                                 super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[skinRef->index]->
                                super_Object).id,bufferRef,(ulong)aimesh->mNumVertices,__s_00,VEC4,
                        VEC4,ComponentType_FLOAT,false);
    local_b0.vector = RVar35.vector;
    local_b0.index = RVar35.index;
    if (local_b0.vector != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
      iVar10._M_current = *(pointer *)((long)&pPVar7[-1].attributes.weight + 8);
      if (iVar10._M_current == *(pointer *)((long)&pPVar7[-1].attributes.weight + 0x10)) {
        std::vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>::
        _M_realloc_insert<glTF2::Ref<glTF2::Accessor>const&>
                  ((vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>
                    *)&pPVar7[-1].attributes.weight,iVar10,&local_b0);
      }
      else {
        (iVar10._M_current)->vector = local_b0.vector;
        *(ulong *)&(iVar10._M_current)->index = CONCAT44(local_b0._12_4_,local_b0.index);
        ppRVar2 = (pointer *)((long)&pPVar7[-1].attributes.weight + 8);
        *ppRVar2 = *ppRVar2 + 1;
      }
    }
    operator_delete__(pvVar22);
    operator_delete__(__s_00);
    operator_delete__(__s);
  }
  return;
}

Assistant:

void ExportSkin(Asset& mAsset, const aiMesh* aimesh, Ref<Mesh>& meshRef, Ref<Buffer>& bufferRef, Ref<Skin>& skinRef, std::vector<aiMatrix4x4>& inverseBindMatricesData)
{
    if (aimesh->mNumBones < 1) {
        return;
    }

    // Store the vertex joint and weight data.
    const size_t NumVerts( aimesh->mNumVertices );
    vec4* vertexJointData = new vec4[ NumVerts ];
    vec4* vertexWeightData = new vec4[ NumVerts ];
    int* jointsPerVertex = new int[ NumVerts ];
    for (size_t i = 0; i < NumVerts; ++i) {
        jointsPerVertex[i] = 0;
        for (size_t j = 0; j < 4; ++j) {
            vertexJointData[i][j] = 0;
            vertexWeightData[i][j] = 0;
        }
    }

    for (unsigned int idx_bone = 0; idx_bone < aimesh->mNumBones; ++idx_bone) {
        const aiBone* aib = aimesh->mBones[idx_bone];

        // aib->mName   =====>  skinRef->jointNames
        // Find the node with id = mName.
        Ref<Node> nodeRef = mAsset.nodes.Get(aib->mName.C_Str());
        nodeRef->jointName = nodeRef->name;

        unsigned int jointNamesIndex = 0;
        bool addJointToJointNames = true;
        for ( unsigned int idx_joint = 0; idx_joint < skinRef->jointNames.size(); ++idx_joint) {
            if (skinRef->jointNames[idx_joint]->jointName.compare(nodeRef->jointName) == 0) {
                addJointToJointNames = false;
                jointNamesIndex = idx_joint;
            }
        }

        if (addJointToJointNames) {
            skinRef->jointNames.push_back(nodeRef);

            // aib->mOffsetMatrix   =====>  skinRef->inverseBindMatrices
            aiMatrix4x4 tmpMatrix4;
            CopyValue(aib->mOffsetMatrix, tmpMatrix4);
            inverseBindMatricesData.push_back(tmpMatrix4);
            jointNamesIndex = static_cast<unsigned int>(inverseBindMatricesData.size() - 1);
        }

        // aib->mWeights   =====>  vertexWeightData
        for (unsigned int idx_weights = 0; idx_weights < aib->mNumWeights; ++idx_weights) {
            unsigned int vertexId = aib->mWeights[idx_weights].mVertexId;
            float vertWeight      = aib->mWeights[idx_weights].mWeight;

            // A vertex can only have at most four joint weights. Ignore all others.
            if (jointsPerVertex[vertexId] > 3) {
                continue;
            }

            vertexJointData[vertexId][jointsPerVertex[vertexId]] = static_cast<float>(jointNamesIndex);
            vertexWeightData[vertexId][jointsPerVertex[vertexId]] = vertWeight;

            jointsPerVertex[vertexId] += 1;
        }

    } // End: for-loop mNumMeshes

    Mesh::Primitive& p = meshRef->primitives.back();
    Ref<Accessor> vertexJointAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices, vertexJointData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexJointAccessor ) {
        size_t offset = vertexJointAccessor->bufferView->byteOffset;
        size_t bytesLen = vertexJointAccessor->bufferView->byteLength;
        unsigned int s_bytesPerComp= ComponentTypeSize(ComponentType_UNSIGNED_SHORT);
        unsigned int bytesPerComp = ComponentTypeSize(vertexJointAccessor->componentType);
        size_t s_bytesLen = bytesLen * s_bytesPerComp / bytesPerComp;
        Ref<Buffer> buf = vertexJointAccessor->bufferView->buffer;
        uint8_t* arrys = new uint8_t[bytesLen];
        unsigned int i = 0;
        for ( unsigned int j = 0; j <= bytesLen; j += bytesPerComp ){
            size_t len_p = offset + j;
            float f_value = *(float *)&buf->GetPointer()[len_p];
            unsigned short c = static_cast<unsigned short>(f_value);
            memcpy(&arrys[i*s_bytesPerComp], &c, s_bytesPerComp);
            ++i;
        }
        buf->ReplaceData_joint(offset, bytesLen, arrys, bytesLen);
        vertexJointAccessor->componentType = ComponentType_UNSIGNED_SHORT;
        vertexJointAccessor->bufferView->byteLength = s_bytesLen;

        p.attributes.joint.push_back( vertexJointAccessor );
        delete[] arrys;
    }

    Ref<Accessor> vertexWeightAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices,
            vertexWeightData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexWeightAccessor ) {
        p.attributes.weight.push_back( vertexWeightAccessor );
    }
    delete[] jointsPerVertex;
    delete[] vertexWeightData;
    delete[] vertexJointData;
}